

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

bool Search::cached_action_store_or_find
               (search_private *priv,ptag mytag,ptag *condition_on,char *condition_on_names,
               action_repr *condition_on_actions,size_t condition_on_cnt,int policy,
               size_t learner_id,action *a,bool do_store,float *a_cost)

{
  float fVar1;
  uint uVar2;
  byte *pbVar3;
  scored_action *psVar4;
  uchar *puVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  long lVar9;
  uint uVar10;
  v_hashmap<unsigned_char_*,_Search::scored_action> *this;
  size_t nmemb;
  ulong hash;
  uchar *local_40;
  scored_action local_38;
  
  if ((mytag != 0) && (priv->no_caching == false)) {
    nmemb = (condition_on_cnt * 9 & 0xfffffffffffffffc) + 0x24;
    if ((condition_on_cnt * 9 & 3) == 0) {
      nmemb = condition_on_cnt * 9 + 0x20;
    }
    local_40 = calloc_or_throw<unsigned_char>(nmemb);
    *local_40 = (uchar)nmemb;
    local_40[8] = (uchar)mytag;
    local_40[0xc] = (uchar)policy;
    local_40[0x10] = (uchar)learner_id;
    local_40[0x18] = (uchar)condition_on_cnt;
    if (condition_on_cnt != 0) {
      puVar5 = local_40 + 0x20;
      sVar8 = 0;
      do {
        *puVar5 = (uchar)condition_on[sVar8];
        puVar5[4] = (uchar)condition_on_actions->a;
        puVar5[8] = condition_on_names[sVar8];
        puVar5 = puVar5 + 9;
        sVar8 = sVar8 + 1;
        condition_on_actions = condition_on_actions + 1;
      } while (condition_on_cnt != sVar8);
    }
    uVar2 = (uint)nmemb;
    uVar6 = uVar2;
    if ((int)uVar2 < 0) {
      uVar6 = uVar2 + 3;
    }
    pbVar3 = local_40 + (int)(uVar6 & 0xfffffffc);
    uVar10 = 0xd5b;
    if (6 < uVar2 + 3) {
      lVar9 = (long)-((int)uVar6 >> 2);
      do {
        uVar10 = ((uint)(*(int *)(pbVar3 + lVar9 * 4) * -0x3361d2af) >> 0x11 |
                 *(int *)(pbVar3 + lVar9 * 4) * 0x16a88000) * 0x1b873593 ^ uVar10;
        uVar10 = (uVar10 << 0xd | uVar10 >> 0x13) * 5 + 0xe6546b64;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0);
    }
    uVar7 = 0;
    uVar6 = 0;
    switch(uVar2 & 3) {
    case 3:
      uVar6 = (uint)pbVar3[2] << 0x10;
    case 2:
      uVar7 = uVar6 | (uint)pbVar3[1] << 8;
    case 1:
      uVar10 = uVar10 ^ ((*pbVar3 ^ uVar7) * -0x3361d2af >> 0x11 | (*pbVar3 ^ uVar7) * 0x16a88000) *
                        0x1b873593;
    case 0:
      uVar2 = ((uVar10 ^ uVar2) >> 0x10 ^ uVar10 ^ uVar2) * -0x7a143595;
      uVar2 = (uVar2 >> 0xd ^ uVar2) * -0x3d4d51cb;
      hash = (ulong)(uVar2 >> 0x10 ^ uVar2);
      this = &priv->cache_hash_map;
      if (do_store) {
        local_38.a = *a;
        local_38.s = *a_cost;
        v_hashmap<unsigned_char_*,_Search::scored_action>::get(this,&local_40,hash);
        v_hashmap<unsigned_char_*,_Search::scored_action>::put_after_get
                  (this,&local_40,hash,&local_38);
        do_store = true;
      }
      else {
        psVar4 = v_hashmap<unsigned_char_*,_Search::scored_action>::get(this,&local_40,hash);
        fVar1 = psVar4->s;
        *a = psVar4->a;
        *a_cost = fVar1;
        free(local_40);
        do_store = *a != 0xffffffff;
      }
    }
  }
  return do_store;
}

Assistant:

bool cached_action_store_or_find(search_private& priv, ptag mytag, const ptag* condition_on,
    const char* condition_on_names, action_repr* condition_on_actions, size_t condition_on_cnt, int policy,
    size_t learner_id, action& a, bool do_store, float& a_cost)
{
  if (priv.no_caching)
    return do_store;
  if (mytag == 0)
    return do_store;  // don't attempt to cache when tag is zero

  size_t sz = sizeof(size_t) + sizeof(ptag) + sizeof(int) + sizeof(size_t) + sizeof(size_t) +
      condition_on_cnt * (sizeof(ptag) + sizeof(action) + sizeof(char));
  if (sz % 4 != 0)
    sz += 4 - (sz % 4);  // make sure sz aligns to 4 so that uniform_hash does the right thing

  unsigned char* item = calloc_or_throw<unsigned char>(sz);
  unsigned char* here = item;
  *here = (unsigned char)sz;
  here += sizeof(size_t);
  *here = mytag;
  here += sizeof(ptag);
  *here = policy;
  here += sizeof(int);
  *here = (unsigned char)learner_id;
  here += sizeof(size_t);
  *here = (unsigned char)condition_on_cnt;
  here += sizeof(size_t);
  for (size_t i = 0; i < condition_on_cnt; i++)
  {
    *here = condition_on[i];
    here += sizeof(ptag);
    *here = condition_on_actions[i].a;
    here += sizeof(action);
    *here = condition_on_names[i];
    here += sizeof(char);  // SPEEDUP: should we align this at 4?
  }
  uint64_t hash = uniform_hash(item, sz, 3419);

  if (do_store)
  {
    priv.cache_hash_map.put(item, hash, scored_action(a, a_cost));
    return true;
  }
  else  // its a find
  {
    scored_action sa = priv.cache_hash_map.get(item, hash);
    a = sa.a;
    a_cost = sa.s;
    free(item);
    return a != (action)-1;
  }
}